

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O1

int __thiscall
ncnn::Interp::forward
          (Interp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint outw_00;
  uint outw_01;
  Mat *pMVar15;
  void *pvVar16;
  int size;
  int iVar17;
  uint uVar18;
  int *piVar19;
  int *xofs;
  long lVar20;
  int *piVar21;
  int iVar22;
  void *pvVar23;
  void *pvVar24;
  void *pvVar25;
  int iVar26;
  void *pvVar27;
  void *pvVar28;
  uint uVar29;
  long lVar30;
  void *pvVar31;
  long lVar32;
  void *pvVar33;
  float *pfVar34;
  int *piVar35;
  ulong uVar36;
  float *pfVar37;
  ulong uVar38;
  long lVar39;
  float *rows1p_1;
  ulong uVar40;
  long lVar41;
  void *pvVar42;
  ulong uVar43;
  uint uVar44;
  long lVar45;
  undefined4 *puVar46;
  int iVar47;
  float *rows2p;
  long lVar48;
  Mat *pMVar49;
  float fVar50;
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int outh;
  int outw;
  float *rows3p_1;
  uint local_1d8;
  uint local_1d4;
  void *local_1d0;
  Mat *local_1c8;
  float *local_1c0;
  float *local_1b8;
  ulong local_1b0;
  Mat *local_1a8;
  float *local_1a0;
  float *local_198;
  int *local_190;
  int *local_188;
  ulong local_180;
  Mat local_178;
  Mat local_128;
  int *local_d8;
  ulong local_d0;
  Mat local_c8;
  float *local_80;
  Mat local_78;
  
  local_1c8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  pMVar49 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = local_1c8->w;
  uVar18 = local_1c8->h;
  uVar43 = (ulong)uVar18;
  local_1b0 = (ulong)(uint)local_1c8->c;
  iVar22 = local_1c8->dims;
  sVar6 = local_1c8->elemsize;
  local_1d4 = local_1c8[1].w;
  local_1d8 = local_1c8[1].h;
  if (((this->size_expr)._M_string_length != 0) &&
     (iVar17 = eval_size_expr(this,bottom_blobs,(int *)&local_1d4,(int *)&local_1d8), iVar17 != 0))
  {
    return -1;
  }
  pMVar15 = local_1c8;
  uVar44 = local_1d4;
  uVar29 = local_1d8;
  lVar30 = (long)(int)local_1d4;
  uVar40 = (ulong)local_1d4;
  local_1a8 = pMVar49;
  if (iVar22 == 2) {
    if (local_1d4 == uVar5) goto LAB_0044bdf7;
    Mat::create(pMVar49,local_1d4,uVar18,sVar6,opt->blob_allocator);
    pvVar28 = pMVar49->data;
    if (pvVar28 == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar49->c * pMVar49->cstep == 0) {
      return -100;
    }
    if (this->resize_type == 2) {
      uVar36 = 0xffffffffffffffff;
      if (-1 < (int)uVar44) {
        uVar36 = lVar30 * 0xc;
      }
      piVar21 = (int *)operator_new__(uVar36);
      linear_coeffs(uVar5,uVar44,piVar21,(float *)(piVar21 + lVar30),this->align_corner);
      if (0 < (int)uVar18) {
        pvVar28 = local_1c8->data;
        iVar22 = local_1c8->w;
        sVar6 = local_1c8->elemsize;
        pvVar27 = pMVar49->data;
        iVar17 = pMVar49->w;
        sVar7 = pMVar49->elemsize;
        uVar36 = 0;
        do {
          if (0 < (int)uVar44) {
            uVar38 = 0;
            do {
              uVar3 = *(undefined8 *)(piVar21 + lVar30 + uVar38 * 2);
              uVar4 = *(undefined8 *)
                       ((long)pvVar28 + (long)piVar21[uVar38] * 4 + (long)iVar22 * sVar6 * uVar36);
              *(float *)((long)pvVar27 + uVar38 * 4) =
                   (float)((ulong)uVar4 >> 0x20) * (float)((ulong)uVar3 >> 0x20) +
                   (float)uVar4 * (float)uVar3;
              uVar38 = uVar38 + 1;
            } while (uVar40 != uVar38);
          }
          uVar36 = uVar36 + 1;
          pvVar27 = (void *)((long)pvVar27 + (long)iVar17 * sVar7);
        } while (uVar36 != uVar43);
      }
      operator_delete__(piVar21);
    }
    else if (this->resize_type == 1) {
      if ((this->output_width == 0) && ((this->size_expr)._M_string_length == 0)) {
        fVar50 = 1.0 / this->width_scale;
      }
      else {
        fVar50 = (float)(int)uVar5 / (float)(int)uVar44;
      }
      pMVar49 = local_1a8;
      if (0 < (int)uVar18) {
        pvVar27 = local_1c8->data;
        iVar22 = local_1c8->w;
        sVar6 = local_1c8->elemsize;
        iVar17 = local_1a8->w;
        sVar7 = local_1a8->elemsize;
        uVar36 = 0;
        do {
          if (0 < (int)uVar44) {
            lVar45 = 0;
            do {
              iVar26 = (int)((float)(int)lVar45 * fVar50);
              iVar47 = uVar5 - 1;
              if (iVar26 <= (int)(uVar5 - 1)) {
                iVar47 = iVar26;
              }
              *(undefined4 *)((long)pvVar28 + lVar45 * 4) =
                   *(undefined4 *)((long)pvVar27 + (long)iVar47 * 4 + (long)iVar22 * sVar6 * uVar36)
              ;
              lVar45 = lVar45 + 1;
            } while (uVar44 != (uint)lVar45);
          }
          uVar36 = uVar36 + 1;
          pvVar28 = (void *)((long)pvVar28 + (long)iVar17 * sVar7);
        } while (uVar36 != uVar43);
      }
    }
    if (this->resize_type != 3) {
      return 0;
    }
    uVar36 = 0xffffffffffffffff;
    if (-1 < (int)uVar44) {
      uVar36 = lVar30 * 0x14;
    }
    piVar21 = (int *)operator_new__(uVar36);
    cubic_coeffs(uVar5,uVar44,piVar21,(float *)(piVar21 + lVar30),this->align_corner);
    if (0 < (int)uVar18) {
      iVar22 = local_1c8->w;
      sVar6 = local_1c8->elemsize;
      pvVar28 = local_1c8->data;
      iVar17 = pMVar49->w;
      sVar7 = pMVar49->elemsize;
      pvVar27 = pMVar49->data;
      uVar36 = 0;
      do {
        if (0 < (int)uVar44) {
          lVar45 = 0;
          do {
            pfVar34 = (float *)(piVar21 + lVar30 + lVar45);
            pfVar37 = (float *)((long)pvVar28 +
                               (long)*(int *)((long)piVar21 + lVar45) * 4 +
                               (long)iVar22 * sVar6 * uVar36 + -4);
            *(float *)((long)pvVar27 + lVar45) =
                 pfVar37[3] * pfVar34[3] + pfVar37[1] * pfVar34[1] +
                 pfVar37[2] * pfVar34[2] + *pfVar37 * *pfVar34;
            lVar45 = lVar45 + 4;
          } while (uVar40 * 4 - lVar45 != 0);
        }
        uVar36 = uVar36 + 1;
        pvVar27 = (void *)((long)pvVar27 + (long)iVar17 * sVar7);
      } while (uVar36 != uVar43);
    }
  }
  else {
    if (iVar22 == 1) {
      Mat::create(pMVar49,local_1d4,local_1d8,uVar5,sVar6,opt->blob_allocator);
      auVar14 = _DAT_005f1bd0;
      auVar13 = _DAT_005f1bc0;
      auVar12 = _DAT_005f1070;
      if (pMVar49->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar49->c * pMVar49->cstep != 0) {
        if ((int)uVar5 < 1) {
          return 0;
        }
        uVar38 = (long)pMVar49->h * (long)pMVar49->w;
        uVar43 = pMVar49->elemsize;
        uVar36 = 0;
        uVar40 = (uVar43 * uVar38 + 0xf & 0xfffffffffffffff0) / uVar43;
        if (pMVar49->dims == 4) {
          uVar40 = uVar38;
        }
        pvVar28 = local_1c8->data;
        uVar18 = (int)uVar40 * pMVar49->d;
        lVar30 = (ulong)uVar18 - 1;
        auVar51._8_4_ = (int)lVar30;
        auVar51._0_8_ = lVar30;
        auVar51._12_4_ = (int)((ulong)lVar30 >> 0x20);
        lVar30 = (long)pMVar49->data + 0xc;
        sVar6 = pMVar49->cstep;
        auVar51 = auVar51 ^ _DAT_005f1070;
        do {
          if (0 < (int)uVar18) {
            uVar2 = *(undefined4 *)((long)pvVar28 + uVar36 * 4);
            uVar40 = 0;
            do {
              auVar53._8_4_ = (int)uVar40;
              auVar53._0_8_ = uVar40;
              auVar53._12_4_ = (int)(uVar40 >> 0x20);
              auVar54 = (auVar53 | auVar14) ^ auVar12;
              iVar22 = auVar51._4_4_;
              if ((bool)(~(iVar22 < auVar54._4_4_ ||
                          auVar51._0_4_ < auVar54._0_4_ && auVar54._4_4_ == iVar22) & 1)) {
                *(undefined4 *)(lVar30 + -0xc + uVar40 * 4) = uVar2;
              }
              if (auVar54._12_4_ <= auVar51._12_4_ &&
                  (auVar54._8_4_ <= auVar51._8_4_ || auVar54._12_4_ != auVar51._12_4_)) {
                *(undefined4 *)(lVar30 + -8 + uVar40 * 4) = uVar2;
              }
              auVar53 = (auVar53 | auVar13) ^ auVar12;
              iVar17 = auVar53._4_4_;
              if (iVar17 <= iVar22 && (iVar17 != iVar22 || auVar53._0_4_ <= auVar51._0_4_)) {
                *(undefined4 *)(lVar30 + -4 + uVar40 * 4) = uVar2;
                *(undefined4 *)(lVar30 + uVar40 * 4) = uVar2;
              }
              uVar40 = uVar40 + 4;
            } while ((uVar18 + 3 & 0xfffffffc) != uVar40);
          }
          uVar36 = uVar36 + 1;
          lVar30 = lVar30 + uVar43 * sVar6;
        } while (uVar36 != uVar5);
        return 0;
      }
      return -100;
    }
    if (local_1d8 == uVar18 && local_1d4 == uVar5) {
LAB_0044bdf7:
      if (pMVar49 != local_1c8) {
        piVar21 = local_1c8->refcount;
        if (piVar21 != (int *)0x0) {
          LOCK();
          *piVar21 = *piVar21 + 1;
          UNLOCK();
        }
        piVar21 = pMVar49->refcount;
        if (piVar21 != (int *)0x0) {
          LOCK();
          *piVar21 = *piVar21 + -1;
          UNLOCK();
          if (*piVar21 == 0) {
            if (pMVar49->allocator == (Allocator *)0x0) {
              if (pMVar49->data != (void *)0x0) {
                free(pMVar49->data);
              }
            }
            else {
              (*pMVar49->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar49->cstep = 0;
        pMVar49->data = (void *)0x0;
        pMVar49->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar49->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar49->elemsize + 4) = 0;
        pMVar49->dims = 0;
        pMVar49->w = 0;
        pMVar49->h = 0;
        pMVar49->d = 0;
        pMVar49->c = 0;
        piVar21 = pMVar15->refcount;
        pMVar49->data = pMVar15->data;
        pMVar49->refcount = piVar21;
        pMVar49->elemsize = pMVar15->elemsize;
        pMVar49->elempack = pMVar15->elempack;
        pMVar49->allocator = pMVar15->allocator;
        iVar22 = pMVar15->w;
        iVar17 = pMVar15->h;
        iVar47 = pMVar15->d;
        pMVar49->dims = pMVar15->dims;
        pMVar49->w = iVar22;
        pMVar49->h = iVar17;
        pMVar49->d = iVar47;
        pMVar49->c = pMVar15->c;
        pMVar49->cstep = pMVar15->cstep;
        return 0;
      }
      return 0;
    }
    Mat::create(pMVar49,local_1d4,local_1d8,(int)local_1b0,sVar6,opt->blob_allocator);
    outw_01 = local_1d4;
    outw_00 = local_1d8;
    if (pMVar49->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar49->c * pMVar49->cstep == 0) {
      return -100;
    }
    if (this->resize_type == 1) {
      if ((this->output_height == 0) && ((this->size_expr)._M_string_length == 0)) {
        fVar50 = 1.0 / this->height_scale;
      }
      else {
        fVar50 = (float)(int)uVar18 / (float)(int)uVar29;
      }
      if ((this->output_width == 0) && ((this->size_expr)._M_string_length == 0)) {
        fVar52 = 1.0 / this->width_scale;
      }
      else {
        fVar52 = (float)(int)uVar5 / (float)(int)uVar44;
      }
      if (0 < (int)local_1b0) {
        local_1c0 = (float *)local_1c8->data;
        sVar6 = local_1c8->cstep;
        sVar7 = local_1c8->elemsize;
        pvVar28 = local_1a8->data;
        sVar8 = local_1a8->cstep;
        sVar9 = local_1a8->elemsize;
        uVar43 = 0;
        do {
          if (0 < (int)local_1d8) {
            puVar46 = (undefined4 *)(sVar8 * sVar9 * uVar43 + (long)pvVar28);
            uVar29 = 0;
            do {
              if (0 < (int)local_1d4) {
                iVar22 = (int)((float)(int)uVar29 * fVar50);
                if ((int)(uVar18 - 1) < (int)((float)(int)uVar29 * fVar50)) {
                  iVar22 = uVar18 - 1;
                }
                uVar44 = 0;
                do {
                  iVar17 = uVar5 - 1;
                  if ((int)((float)(int)uVar44 * fVar52) <= (int)(uVar5 - 1)) {
                    iVar17 = (int)((float)(int)uVar44 * fVar52);
                  }
                  *puVar46 = *(undefined4 *)
                              ((long)local_1c0 +
                              (long)(int)(iVar17 + iVar22 * uVar5) * 4 + sVar6 * sVar7 * uVar43);
                  puVar46 = puVar46 + 1;
                  uVar44 = uVar44 + 1;
                } while (local_1d4 != uVar44);
              }
              uVar29 = uVar29 + 1;
            } while (uVar29 != local_1d8);
          }
          uVar43 = uVar43 + 1;
        } while (uVar43 != local_1b0);
      }
    }
    if (this->resize_type == 2) {
      lVar30 = (long)(int)local_1d4;
      iVar22 = local_1d4 * 3 + local_1d8 * 3;
      uVar43 = 0xffffffffffffffff;
      if (-1 < iVar22) {
        uVar43 = (long)iVar22 * 4;
      }
      piVar19 = (int *)operator_new__(uVar43);
      piVar21 = piVar19 + lVar30;
      lVar45 = (long)(int)outw_00;
      pfVar37 = (float *)(piVar21 + lVar45);
      iVar22 = this->align_corner;
      linear_coeffs(uVar5,outw_01,piVar19,pfVar37,iVar22);
      local_1b8 = pfVar37 + lVar30 * 2;
      local_190 = piVar21;
      linear_coeffs(uVar18,outw_00,piVar21,pfVar37 + lVar30 * 2,iVar22);
      if (0 < (int)local_1b0) {
        uVar43 = 0;
        do {
          local_1c0 = (float *)(long)local_1c8->w;
          local_198 = (float *)local_1c8->elemsize;
          lVar48 = local_1c8->cstep * uVar43 * (long)local_198;
          pvVar28 = local_1c8->data;
          uVar29 = local_1a8->w;
          uVar44 = local_1a8->h;
          pvVar27 = local_1a8->data;
          local_1d0 = (void *)local_1a8->elemsize;
          local_1a0 = (float *)local_1a8->cstep;
          local_178.cstep = 0;
          local_178.data._0_4_ = 0;
          local_178.data._4_4_ = 0;
          local_178.refcount._0_4_ = 0;
          local_178.refcount._4_4_ = 0;
          local_178.elemsize._0_4_ = 0;
          local_178.elemsize._4_4_ = 0;
          local_178.elempack = 0;
          local_178.h = 0;
          local_178.d = 0;
          local_178.c = 0;
          local_178.allocator = (Allocator *)0x0;
          local_178.dims = 0;
          local_178.w = 0;
          local_180 = uVar43;
          Mat::create(&local_178,uVar29,4,(Allocator *)0x0);
          local_128.cstep = 0;
          local_128.data = (void *)0x0;
          local_128.refcount._0_4_ = 0;
          local_128.refcount._4_4_ = 0;
          local_128.elemsize._0_4_ = 0;
          local_128._20_8_ = 0;
          local_128.h = 0;
          local_128.d = 0;
          local_128.c = 0;
          local_128.allocator = (Allocator *)0x0;
          local_128.dims = 0;
          local_128.w = 0;
          Mat::create(&local_128,uVar29,4,(Allocator *)0x0);
          if (0 < (int)uVar44) {
            local_198 = (float *)((long)local_198 * (long)local_1c0);
            local_1c0 = (float *)((long)(int)uVar29 * (long)local_1d0);
            pvVar27 = (void *)((long)pvVar27 + (long)local_1a0 * (long)local_1d0 * local_180);
            pfVar34 = (float *)0x0;
            pvVar23 = (void *)CONCAT44(local_178.data._4_4_,local_178.data._0_4_);
            pfVar37 = local_1b8;
            pvVar31 = local_128.data;
            iVar22 = -2;
            do {
              iVar17 = local_190[(long)pfVar34];
              pvVar24 = pvVar23;
              if (iVar17 != iVar22) {
                if (iVar17 == iVar22 + 1) {
                  pvVar24 = pvVar31;
                  pvVar31 = pvVar23;
                  if (0 < (int)uVar29) {
                    uVar43 = 0;
                    do {
                      uVar3 = *(undefined8 *)
                               ((long)pvVar28 +
                               (long)piVar19[uVar43] * 4 +
                               ((long)iVar17 + 1) * (long)local_198 + lVar48);
                      *(float *)((long)pvVar23 + uVar43 * 4) =
                           (float)((ulong)uVar3 >> 0x20) *
                           (float)((ulong)*(undefined8 *)(piVar19 + lVar30 + lVar45 + uVar43 * 2) >>
                                  0x20) +
                           (float)uVar3 *
                           (float)*(undefined8 *)(piVar19 + lVar30 + lVar45 + uVar43 * 2);
                      uVar43 = uVar43 + 1;
                    } while (uVar29 != uVar43);
                  }
                }
                else if (0 < (int)uVar29) {
                  uVar43 = 0;
                  do {
                    iVar22 = piVar19[uVar43];
                    uVar3 = *(undefined8 *)
                             ((long)pvVar28 +
                             (long)iVar22 * 4 + (long)iVar17 * (long)local_198 + lVar48);
                    fVar50 = (float)*(undefined8 *)(piVar19 + lVar30 + lVar45 + uVar43 * 2);
                    fVar52 = (float)((ulong)*(undefined8 *)(piVar19 + lVar30 + lVar45 + uVar43 * 2)
                                    >> 0x20);
                    *(float *)((long)pvVar23 + uVar43 * 4) =
                         (float)((ulong)uVar3 >> 0x20) * fVar52 + (float)uVar3 * fVar50;
                    uVar3 = *(undefined8 *)
                             ((long)pvVar28 +
                             (long)iVar22 * 4 + (long)(iVar17 + 1) * (long)local_198 + lVar48);
                    *(float *)((long)pvVar31 + uVar43 * 4) =
                         (float)((ulong)uVar3 >> 0x20) * fVar52 + (float)uVar3 * fVar50;
                    uVar43 = uVar43 + 1;
                  } while (uVar29 != uVar43);
                }
              }
              if (0 < (int)uVar29) {
                fVar50 = *pfVar37;
                fVar52 = pfVar37[1];
                lVar41 = 0;
                do {
                  *(float *)((long)pvVar27 + lVar41 * 4) =
                       *(float *)((long)pvVar31 + lVar41 * 4) * fVar52 +
                       *(float *)((long)pvVar24 + lVar41 * 4) * fVar50;
                  lVar41 = lVar41 + 1;
                } while (uVar29 != (uint)lVar41);
              }
              pfVar37 = pfVar37 + 2;
              pfVar34 = (float *)((long)pfVar34 + 1);
              pvVar27 = (void *)((long)pvVar27 + (long)local_1c0);
              pvVar23 = pvVar24;
              iVar22 = iVar17;
              local_1a0 = (float *)(ulong)uVar44;
            } while (pfVar34 != (float *)(ulong)uVar44);
          }
          piVar21 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
          if (piVar21 != (int *)0x0) {
            LOCK();
            *piVar21 = *piVar21 + -1;
            UNLOCK();
            if (*piVar21 == 0) {
              if (local_128.allocator == (Allocator *)0x0) {
                if (local_128.data != (void *)0x0) {
                  free(local_128.data);
                }
              }
              else {
                (*(local_128.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_128.cstep = 0;
          local_128.data = (void *)0x0;
          local_128.refcount._0_4_ = 0;
          local_128.refcount._4_4_ = 0;
          local_128.elemsize._0_4_ = 0;
          local_128._20_8_ = 0;
          local_128.dims = 0;
          local_128.w = 0;
          local_128.h = 0;
          local_128.d = 0;
          local_128.c = 0;
          piVar21 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
          if (piVar21 != (int *)0x0) {
            LOCK();
            *piVar21 = *piVar21 + -1;
            UNLOCK();
            if (*piVar21 == 0) {
              if (local_178.allocator == (Allocator *)0x0) {
                if ((void *)CONCAT44(local_178.data._4_4_,local_178.data._0_4_) != (void *)0x0) {
                  free((void *)CONCAT44(local_178.data._4_4_,local_178.data._0_4_));
                }
              }
              else {
                (*(local_178.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_178.cstep = 0;
          local_178.data._0_4_ = 0;
          local_178.data._4_4_ = 0;
          local_178.refcount._0_4_ = 0;
          local_178.refcount._4_4_ = 0;
          local_178.elemsize._0_4_ = 0;
          local_178.elemsize._4_4_ = 0;
          local_178.elempack = 0;
          local_178.dims = 0;
          local_178.w = 0;
          local_178.h = 0;
          local_178.d = 0;
          local_178.c = 0;
          uVar43 = local_180 + 1;
        } while (uVar43 != local_1b0);
      }
      operator_delete__(piVar19);
    }
    uVar44 = local_1d4;
    uVar29 = local_1d8;
    if (this->resize_type != 3) {
      return 0;
    }
    lVar30 = (long)(int)local_1d4;
    iVar22 = local_1d4 * 5 + local_1d8 * 5;
    uVar43 = 0xffffffffffffffff;
    if (-1 < iVar22) {
      uVar43 = (long)iVar22 * 4;
    }
    xofs = (int *)operator_new__(uVar43);
    piVar19 = xofs + lVar30;
    lVar45 = (long)(int)uVar29;
    pfVar37 = (float *)(piVar19 + lVar45);
    iVar22 = this->align_corner;
    cubic_coeffs(uVar5,uVar44,xofs,pfVar37,iVar22);
    local_80 = pfVar37 + lVar30 * 4;
    cubic_coeffs(uVar18,uVar29,piVar19,pfVar37 + lVar30 * 4,iVar22);
    piVar21 = xofs;
    if (0 < (int)local_1b0) {
      uVar43 = 0;
      pMVar49 = local_1a8;
      local_188 = xofs;
      local_d8 = piVar19;
      do {
        iVar22 = local_1c8->w;
        sVar6 = local_1c8->elemsize;
        local_1b8 = (float *)(local_1c8->cstep * uVar43 * sVar6 + (long)local_1c8->data);
        uVar5 = pMVar49->w;
        local_190 = (int *)(ulong)(uint)pMVar49->h;
        pvVar28 = pMVar49->data;
        local_1c0 = (float *)pMVar49->elemsize;
        sVar7 = pMVar49->cstep;
        local_178.cstep = 0;
        local_178.data._0_4_ = 0;
        local_178.data._4_4_ = 0;
        local_178.refcount._0_4_ = 0;
        local_178.refcount._4_4_ = 0;
        local_178.elemsize._0_4_ = 0;
        local_178.elemsize._4_4_ = 0;
        local_178.elempack = 0;
        local_178.h = 0;
        local_178.d = 0;
        local_178.c = 0;
        local_178.allocator = (Allocator *)0x0;
        local_178.dims = 0;
        local_178.w = 0;
        local_d0 = uVar43;
        Mat::create(&local_178,uVar5,4,(Allocator *)0x0);
        local_128.cstep = 0;
        local_128.data = (void *)0x0;
        local_128.refcount._0_4_ = 0;
        local_128.refcount._4_4_ = 0;
        local_128.elemsize._0_4_ = 0;
        local_128._20_8_ = 0;
        local_128.h = 0;
        local_128.d = 0;
        local_128.c = 0;
        local_128.allocator = (Allocator *)0x0;
        local_128.dims = 0;
        local_128.w = 0;
        Mat::create(&local_128,uVar5,4,(Allocator *)0x0);
        local_c8.cstep = 0;
        local_c8.data = (void *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8._20_8_ = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        Mat::create(&local_c8,uVar5,4,(Allocator *)0x0);
        local_78.cstep = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78._20_8_ = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        Mat::create(&local_78,uVar5,4,(Allocator *)0x0);
        if (0 < (int)local_190) {
          lVar41 = sVar6 * (long)iVar22;
          local_1b8 = local_1b8 + -1;
          lVar48 = (ulong)uVar5 * 4;
          pvVar28 = (void *)((long)pvVar28 + sVar7 * (long)local_1c0 * local_d0);
          local_180 = (long)(int)uVar5 * (long)local_1c0;
          piVar35 = (int *)0x0;
          pvVar27 = local_c8.data;
          pvVar23 = (void *)CONCAT44(local_178.data._4_4_,local_178.data._0_4_);
          pvVar31 = local_78.data;
          pfVar37 = local_80;
          pvVar24 = local_128.data;
          iVar22 = -3;
          do {
            iVar17 = piVar19[(long)piVar35];
            pvVar25 = pvVar23;
            pvVar33 = pvVar31;
            pvVar42 = pvVar24;
            pvVar16 = pvVar27;
            if (iVar17 != iVar22) {
              lVar20 = (long)iVar17;
              local_1d0 = pvVar31;
              if (iVar17 == iVar22 + 1) {
                pvVar25 = pvVar24;
                pvVar33 = pvVar23;
                pvVar42 = pvVar27;
                pvVar16 = pvVar31;
                if (0 < (int)uVar5) {
                  lVar39 = 0;
                  do {
                    pfVar34 = (float *)(xofs + lVar30 + lVar45 + lVar39);
                    pfVar1 = (float *)((long)local_1b8 +
                                      (long)*(int *)((long)piVar21 + lVar39) * 4 +
                                      (lVar20 + 2) * lVar41);
                    *(float *)((long)pvVar23 + lVar39) =
                         pfVar1[3] * pfVar34[3] + pfVar1[1] * pfVar34[1] +
                         pfVar1[2] * pfVar34[2] + *pfVar1 * *pfVar34;
                    lVar39 = lVar39 + 4;
                  } while (lVar48 - lVar39 != 0);
                }
              }
              else if (iVar17 == iVar22 + 2) {
                pvVar25 = pvVar27;
                pvVar33 = pvVar24;
                pvVar42 = pvVar31;
                pvVar16 = pvVar23;
                if (0 < (int)uVar5) {
                  lVar39 = 0;
                  do {
                    iVar22 = *(int *)((long)piVar21 + lVar39);
                    pfVar34 = (float *)(xofs + lVar30 + lVar45 + lVar39);
                    fVar50 = *pfVar34;
                    fVar52 = pfVar34[1];
                    fVar10 = pfVar34[2];
                    fVar11 = pfVar34[3];
                    pfVar34 = (float *)((long)local_1b8 + (long)iVar22 * 4 + (lVar20 + 1) * lVar41);
                    *(float *)((long)pvVar23 + lVar39) =
                         pfVar34[3] * fVar11 + pfVar34[1] * fVar52 +
                         pfVar34[2] * fVar10 + *pfVar34 * fVar50;
                    pfVar34 = (float *)((long)local_1b8 + (long)iVar22 * 4 + (iVar17 + 2) * lVar41);
                    *(float *)((long)pvVar24 + lVar39) =
                         pfVar34[3] * fVar11 + pfVar34[1] * fVar52 +
                         pfVar34[2] * fVar10 + *pfVar34 * fVar50;
                    lVar39 = lVar39 + 4;
                  } while (lVar48 - lVar39 != 0);
                }
              }
              else {
                piVar21 = local_188;
                if (iVar17 == iVar22 + 3) {
                  pvVar25 = pvVar31;
                  pvVar33 = pvVar27;
                  pvVar42 = pvVar23;
                  pvVar16 = pvVar24;
                  if (0 < (int)uVar5) {
                    lVar39 = 0;
                    do {
                      lVar32 = (long)*(int *)((long)local_188 + lVar39);
                      pfVar34 = (float *)(xofs + lVar30 + lVar45 + lVar39);
                      fVar50 = *pfVar34;
                      fVar52 = pfVar34[1];
                      fVar10 = pfVar34[2];
                      fVar11 = pfVar34[3];
                      pfVar34 = (float *)((long)local_1b8 + lVar32 * 4 + lVar20 * lVar41);
                      *(float *)((long)pvVar23 + lVar39) =
                           pfVar34[3] * fVar11 + pfVar34[1] * fVar52 +
                           pfVar34[2] * fVar10 + *pfVar34 * fVar50;
                      pfVar34 = (float *)((long)local_1b8 + lVar32 * 4 + (iVar17 + 1) * lVar41);
                      *(float *)((long)pvVar24 + lVar39) =
                           pfVar34[3] * fVar11 + pfVar34[1] * fVar52 +
                           pfVar34[2] * fVar10 + *pfVar34 * fVar50;
                      pfVar34 = (float *)((long)local_1b8 + lVar32 * 4 + (iVar17 + 2) * lVar41);
                      *(float *)((long)pvVar27 + lVar39) =
                           pfVar34[3] * fVar11 + pfVar34[1] * fVar52 +
                           pfVar34[2] * fVar10 + *pfVar34 * fVar50;
                      lVar39 = lVar39 + 4;
                      piVar19 = local_d8;
                    } while (lVar48 - lVar39 != 0);
                  }
                }
                else if (0 < (int)uVar5) {
                  local_1c0 = (float *)((lVar20 + -1) * lVar41 + (long)local_1b8);
                  local_198 = (float *)(lVar20 * lVar41 + (long)local_1b8);
                  local_1a0 = (float *)((iVar17 + 1) * lVar41 + (long)local_1b8);
                  lVar20 = 0;
                  do {
                    lVar39 = (long)*(int *)((long)local_188 + lVar20);
                    pfVar34 = (float *)(xofs + lVar30 + lVar45 + lVar20);
                    fVar50 = *pfVar34;
                    fVar52 = pfVar34[1];
                    fVar10 = pfVar34[2];
                    fVar11 = pfVar34[3];
                    pfVar34 = local_1c0 + lVar39;
                    *(float *)((long)pvVar23 + lVar20) =
                         pfVar34[3] * fVar11 + pfVar34[1] * fVar52 +
                         pfVar34[2] * fVar10 + *pfVar34 * fVar50;
                    pfVar34 = local_198 + lVar39;
                    *(float *)((long)pvVar24 + lVar20) =
                         pfVar34[3] * fVar11 + pfVar34[1] * fVar52 +
                         pfVar34[2] * fVar10 + *pfVar34 * fVar50;
                    pfVar34 = local_1a0 + lVar39;
                    *(float *)((long)pvVar27 + lVar20) =
                         pfVar34[3] * fVar11 + pfVar34[1] * fVar52 +
                         pfVar34[2] * fVar10 + *pfVar34 * fVar50;
                    pfVar34 = (float *)((long)local_1b8 + lVar39 * 4 + (iVar17 + 2) * lVar41);
                    *(float *)((long)pvVar31 + lVar20) =
                         pfVar34[3] * fVar11 + pfVar34[1] * fVar52 +
                         pfVar34[2] * fVar10 + *pfVar34 * fVar50;
                    lVar20 = lVar20 + 4;
                    piVar19 = local_d8;
                  } while (lVar48 - lVar20 != 0);
                }
              }
            }
            pvVar27 = pvVar16;
            if (0 < (int)uVar5) {
              fVar50 = *pfVar37;
              fVar52 = pfVar37[1];
              fVar10 = pfVar37[2];
              fVar11 = pfVar37[3];
              lVar20 = 0;
              do {
                *(float *)((long)pvVar28 + lVar20 * 4) =
                     *(float *)((long)pvVar33 + lVar20 * 4) * fVar11 +
                     *(float *)((long)pvVar42 + lVar20 * 4) * fVar52 +
                     *(float *)((long)pvVar27 + lVar20 * 4) * fVar10 +
                     *(float *)((long)pvVar25 + lVar20 * 4) * fVar50;
                lVar20 = lVar20 + 1;
              } while (uVar5 != (uint)lVar20);
            }
            pfVar37 = pfVar37 + 4;
            piVar35 = (int *)((long)piVar35 + 1);
            pvVar28 = (void *)((long)pvVar28 + local_180);
            pvVar23 = pvVar25;
            pvVar31 = pvVar33;
            pvVar24 = pvVar42;
            iVar22 = iVar17;
          } while (piVar35 != local_190);
        }
        piVar35 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar35 != (int *)0x0) {
          LOCK();
          *piVar35 = *piVar35 + -1;
          UNLOCK();
          if (*piVar35 == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if (local_78.data != (void *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar49 = local_1a8;
        local_78.cstep = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78._20_8_ = 0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        piVar35 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar35 != (int *)0x0) {
          LOCK();
          *piVar35 = *piVar35 + -1;
          UNLOCK();
          if (*piVar35 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              if (local_c8.data != (void *)0x0) {
                free(local_c8.data);
              }
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_c8.cstep = 0;
        local_c8.data = (void *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8._20_8_ = 0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        piVar35 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
        if (piVar35 != (int *)0x0) {
          LOCK();
          *piVar35 = *piVar35 + -1;
          UNLOCK();
          if (*piVar35 == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              if (local_128.data != (void *)0x0) {
                free(local_128.data);
              }
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_128.cstep = 0;
        local_128.data = (void *)0x0;
        local_128.refcount._0_4_ = 0;
        local_128.refcount._4_4_ = 0;
        local_128.elemsize._0_4_ = 0;
        local_128._20_8_ = 0;
        local_128.dims = 0;
        local_128.w = 0;
        local_128.h = 0;
        local_128.d = 0;
        local_128.c = 0;
        piVar35 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
        if (piVar35 != (int *)0x0) {
          LOCK();
          *piVar35 = *piVar35 + -1;
          UNLOCK();
          if (*piVar35 == 0) {
            if (local_178.allocator == (Allocator *)0x0) {
              if ((void *)CONCAT44(local_178.data._4_4_,local_178.data._0_4_) != (void *)0x0) {
                free((void *)CONCAT44(local_178.data._4_4_,local_178.data._0_4_));
              }
            }
            else {
              (*(local_178.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_178.cstep = 0;
        local_178.data._0_4_ = 0;
        local_178.data._4_4_ = 0;
        local_178.refcount._0_4_ = 0;
        local_178.refcount._4_4_ = 0;
        local_178.elemsize._0_4_ = 0;
        local_178.elemsize._4_4_ = 0;
        local_178.elempack = 0;
        local_178.dims = 0;
        local_178.w = 0;
        local_178.h = 0;
        local_178.d = 0;
        local_178.c = 0;
        uVar43 = local_d0 + 1;
      } while (uVar43 != local_1b0);
    }
  }
  operator_delete__(piVar21);
  return 0;
}

Assistant:

int Interp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = reference_blob.w;
    int outh = reference_blob.h;

    if (!size_expr.empty())
    {
        int r = eval_size_expr(bottom_blobs, outw, outh);
        if (r != 0)
            return -1;
    }

    if (dims == 1)
    {
        // special case for 2d resize on flattened blob
        top_blob.create(outw, outh, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < w; q++)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float v = bottom_blob[q];
            top_blob_c.fill(v);
        }

        return 0;
    }

    if (dims == 2)
    {
        if (outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(outw, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (resize_type == 1) // nearest
        {
            const float ws = (output_width || !size_expr.empty()) ? w / (float)outw : 1.f / width_scale;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_x];
                }
            }
        }

        if (resize_type == 2) // bilinear
        {
            int* buf = new int[outw + outw * 2];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            linear_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    *outptr++ = Sp[0] * a0 + Sp[1] * a1;
                    alphap += 2;
                }
            }

            delete[] buf;
        }

        if (resize_type == 3) // bicubic
        {
            int* buf = new int[outw + outw * 4];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            cubic_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    float a2 = alphap[2];
                    float a3 = alphap[3];
                    *outptr++ = Sp[-1] * a0 + Sp[0] * a1 + Sp[1] * a2 + Sp[2] * a3;
                    alphap += 4;
                }
            }

            delete[] buf;
        }

        return 0;
    }

    if (outw == w && outh == h)
    {
        top_blob = bottom_blob;
        return 0;
    }

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (resize_type == 1) // nearest
    {
        const float hs = (output_height || !size_expr.empty()) ? h / (float)outh : 1.f / height_scale;
        const float ws = (output_width || !size_expr.empty()) ? w / (float)outw : 1.f / width_scale;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            for (int y = 0; y < outh; y++)
            {
                int in_y = std::min((int)(y * hs), (h - 1));
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_y * w + in_x];
                }
            }
        }
    }

    if (resize_type == 2) // bilinear
    {
        int* buf = new int[outw + outh + outw * 2 + outh * 2];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 2];
        float* beta = (float*)(buf + outw + outh + outw * 2); //new float[outh * 2];

        linear_coeffs(w, outw, xofs, alpha, align_corner);
        linear_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    if (resize_type == 3) // bicubic
    {
        int* buf = new int[outw + outh + outw * 4 + outh * 4];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 4];
        float* beta = (float*)(buf + outw + outh + outw * 4); //new float[outh * 4];

        cubic_coeffs(w, outw, xofs, alpha, align_corner);
        cubic_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    return 0;
}